

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O2

void ihevc_inter_pred_chroma_vert_w16out
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  short sVar4;
  byte *pbVar5;
  ulong uVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  
  lVar2 = (long)src_strd;
  uVar6 = 0;
  uVar1 = (ulong)(uint)(wd * 2);
  if (wd * 2 < 1) {
    uVar1 = uVar6;
  }
  if (ht < 1) {
    ht = 0;
  }
  pbVar5 = pu1_src + -lVar2;
  for (; (int)uVar6 != ht; uVar6 = (ulong)((int)uVar6 + 1)) {
    pbVar7 = pbVar5;
    for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
      sVar4 = 0;
      pbVar9 = pbVar7;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        sVar4 = sVar4 + (ushort)*pbVar9 * (short)pi1_coeff[lVar8];
        pbVar9 = pbVar9 + lVar2;
      }
      pi2_dst[uVar3] = sVar4;
      pbVar7 = pbVar7 + 1;
    }
    pi2_dst = pi2_dst + dst_strd;
    pbVar5 = pbVar5 + lVar2;
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_vert_w16out(UWORD8 *pu1_src,
                                         WORD16 *pi2_dst,
                                         WORD32 src_strd,
                                         WORD32 dst_strd,
                                         WORD8 *pi1_coeff,
                                         WORD32 ht,
                                         WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col++)
        {
            i2_tmp = 0;
            for(i = 0; i < NTAPS_CHROMA; i++)
            {
                i2_tmp += pi1_coeff[i] * pu1_src[col + (i - 1) * src_strd];
            }

            pi2_dst[col] = i2_tmp;
        }

        pu1_src += src_strd;
        pi2_dst += dst_strd;
    }
}